

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O2

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcFaceBound>
                 (DB *db,LIST *params,IfcFaceBound *in)

{
  undefined1 *puVar1;
  size_t sVar2;
  long lVar3;
  TypeError *this;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  string local_70;
  allocator<char> local_50 [32];
  
  sVar2 = GenericFill<Assimp::IFC::Schema_2x3::IfcTopologicalRepresentationItem>
                    (db,params,&in->super_IfcTopologicalRepresentationItem);
  if (0x10 < (ulong)((long)(params->members).
                           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(params->members).
                          super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    EXPRESS::LIST::operator[]((LIST *)&arg,(size_t)params);
    lVar3 = __dynamic_cast(arg.
                           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0);
    if (lVar3 == 0) {
      GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcLoop>>
                ((Lazy<Assimp::IFC::Schema_2x3::IfcLoop> *)
                 &(in->super_IfcTopologicalRepresentationItem).field_0x30,&arg,db);
    }
    else {
      puVar1 = &(in->super_IfcTopologicalRepresentationItem).field_0x28;
      *puVar1 = *puVar1 | 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&arg.
                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    EXPRESS::LIST::operator[]((LIST *)&arg,(size_t)params);
    lVar3 = __dynamic_cast(arg.
                           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0);
    if (lVar3 == 0) {
      GenericConvert<std::__cxx11::string>(&in->Orientation,&arg,db);
    }
    else {
      puVar1 = &(in->super_IfcTopologicalRepresentationItem).field_0x28;
      *puVar1 = *puVar1 | 2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&arg.
                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return sVar2 + 2;
  }
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"expected 2 arguments to IfcFaceBound",local_50);
  TypeError::TypeError(this,&local_70,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GenericFill<IfcFaceBound>(const DB& db, const LIST& params, IfcFaceBound* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcTopologicalRepresentationItem*>(in));
	if (params.GetSize() < 2) { throw STEP::TypeError("expected 2 arguments to IfcFaceBound"); }    do { // convert the 'Bound' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcFaceBound,2>::aux_is_derived[0]=true; break; }
        try { GenericConvert( in->Bound, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 0 to IfcFaceBound to be a `IfcLoop`")); }
    } while(0);
    do { // convert the 'Orientation' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcFaceBound,2>::aux_is_derived[1]=true; break; }
        try { GenericConvert( in->Orientation, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 1 to IfcFaceBound to be a `BOOLEAN`")); }
    } while(0);
	return base;
}